

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall p2t::Sweep::~Sweep(Sweep *this)

{
  size_type sVar1;
  reference ppNVar2;
  undefined8 local_18;
  size_t i;
  Sweep *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<p2t::Node_*,_std::allocator<p2t::Node_*>_>::size(&this->nodes_);
    if (sVar1 <= local_18) break;
    ppNVar2 = std::vector<p2t::Node_*,_std::allocator<p2t::Node_*>_>::operator[]
                        (&this->nodes_,local_18);
    if (*ppNVar2 != (value_type)0x0) {
      operator_delete(*ppNVar2);
    }
    local_18 = local_18 + 1;
  }
  std::vector<p2t::Node_*,_std::allocator<p2t::Node_*>_>::~vector(&this->nodes_);
  return;
}

Assistant:

Sweep::~Sweep() {

    // Clean up memory
    for(size_t i = 0; i < nodes_.size(); i++) {
        delete nodes_[i];
    }

}